

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONScanner.cpp
# Opt level: O2

void __thiscall JSON::JSONScanner::Finalizer(JSONScanner *this)

{
  if (this->allocatorObject != (TempGuestArenaAllocatorObject *)0x0) {
    Js::ScriptContext::ReleaseTemporaryGuestAllocator(this->scriptContext,this->allocatorObject);
    return;
  }
  return;
}

Assistant:

void JSONScanner::Finalizer()
    {
        // All dynamic memory allocated by this object is on the arena - either the one this object owns or by the
        // one shared with JSON parser - here we will deallocate ours. The others will be deallocated when JSONParser
        // goes away which should happen right after this.
        if (this->allocatorObject != nullptr)
        {
            // We created our own allocator, so we have to free it
            this->scriptContext->ReleaseTemporaryGuestAllocator(allocatorObject);
        }
    }